

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invocation_interlock_placement_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::InvocationInterlockPlacementPass::isFragmentShaderInterlockEnabled
          (InvocationInterlockPlacementPass *this)

{
  bool bVar1;
  bool bVar2;
  FeatureManager *pFVar3;
  
  pFVar3 = IRContext::get_feature_mgr((this->super_Pass).context_);
  bVar1 = EnumSet<spvtools::Extension>::contains
                    (&pFVar3->extensions_,kSPV_EXT_fragment_shader_interlock);
  if (bVar1) {
    pFVar3 = IRContext::get_feature_mgr((this->super_Pass).context_);
    bVar2 = EnumSet<spv::Capability>::contains
                      (&pFVar3->capabilities_,CapabilityFragmentShaderSampleInterlockEXT);
    bVar1 = true;
    if (!bVar2) {
      pFVar3 = IRContext::get_feature_mgr((this->super_Pass).context_);
      bVar2 = EnumSet<spv::Capability>::contains
                        (&pFVar3->capabilities_,CapabilityFragmentShaderPixelInterlockEXT);
      if (!bVar2) {
        pFVar3 = IRContext::get_feature_mgr((this->super_Pass).context_);
        bVar1 = EnumSet<spv::Capability>::contains
                          (&pFVar3->capabilities_,CapabilityFragmentShaderShadingRateInterlockEXT);
        return bVar1;
      }
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool InvocationInterlockPlacementPass::isFragmentShaderInterlockEnabled() {
  if (!context()->get_feature_mgr()->HasExtension(
          kSPV_EXT_fragment_shader_interlock)) {
    return false;
  }

  if (context()->get_feature_mgr()->HasCapability(
          spv::Capability::FragmentShaderSampleInterlockEXT)) {
    return true;
  }

  if (context()->get_feature_mgr()->HasCapability(
          spv::Capability::FragmentShaderPixelInterlockEXT)) {
    return true;
  }

  if (context()->get_feature_mgr()->HasCapability(
          spv::Capability::FragmentShaderShadingRateInterlockEXT)) {
    return true;
  }

  return false;
}